

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall crnlib::mip_level::can_unflip_without_unpacking(mip_level *this)

{
  dxt_image *this_00;
  bool bVar1;
  bool bVar2;
  orientation_flags_t oVar3;
  
  this_00 = this->m_pDXTImage;
  bVar1 = this->m_pImage != (image_u8 *)0x0 || this_00 != (dxt_image *)0x0;
  if (this_00 != (dxt_image *)0x0) {
    oVar3 = this->m_orient_flags;
    bVar1 = true;
    if ((oVar3 & cOrientationFlagXFlipped) != cDefaultOrientationFlags) {
      bVar1 = dxt_image::can_flip(this_00,0);
      oVar3 = this->m_orient_flags;
    }
    if ((oVar3 & cOrientationFlagYFlipped) != cDefaultOrientationFlags) {
      bVar2 = dxt_image::can_flip(this->m_pDXTImage,1);
      bVar1 = (bool)(bVar1 & bVar2);
    }
  }
  return bVar1;
}

Assistant:

bool mip_level::can_unflip_without_unpacking() const {
  if (!is_valid())
    return false;

  if (!is_packed())
    return true;

  bool can_unflip = true;
  if (m_orient_flags & cOrientationFlagXFlipped) {
    if (!m_pDXTImage->can_flip(0))
      can_unflip = false;
  }
  if (m_orient_flags & cOrientationFlagYFlipped) {
    if (!m_pDXTImage->can_flip(1))
      can_unflip = false;
  }

  return can_unflip;
}